

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O0

uint32_t __thiscall rgbcx::hist4::lookup_total_ordering_index(hist4 *this)

{
  hist4 *this_local;
  uint local_4;
  
  if (this->m_hist[0] == '\x10') {
    local_4 = 0xf;
  }
  else if (this->m_hist[1] == '\x10') {
    local_4 = 700;
  }
  else if (this->m_hist[2] == '\x10') {
    local_4 = 0x2f1;
  }
  else if (this->m_hist[3] == '\x10') {
    local_4 = 0x203;
  }
  else {
    local_4 = (uint)*(ushort *)
                     (g_total_ordering4_hash +
                     (long)(int)((uint)this->m_hist[0] | (uint)this->m_hist[1] << 4 |
                                (uint)this->m_hist[2] << 8) * 2);
  }
  return local_4;
}

Assistant:

inline uint32_t lookup_total_ordering_index() const
		{
			if (m_hist[0] == 16)
				return TOTAL_ORDER_4_0_16;
			else if (m_hist[1] == 16)
				return TOTAL_ORDER_4_1_16;
			else if (m_hist[2] == 16)
				return TOTAL_ORDER_4_2_16;
			else if (m_hist[3] == 16)
				return TOTAL_ORDER_4_3_16;

			// Must sum to 16, so m_hist[3] isn't needed.
			return g_total_ordering4_hash[m_hist[0] | (m_hist[1] << 4) | (m_hist[2] << 8)];
		}